

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileGuard.h
# Opt level: O2

void __thiscall jbcoin::KeyFileGuard::~KeyFileGuard(KeyFileGuard *this)

{
  rmDir(this,&this->subDir_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~KeyFileGuard ()
    {
        try
        {
            using namespace boost::filesystem;

            rmDir (subDir_);
        }
        catch (std::exception& e)
        {
            // if we throw here, just let it die.
            test_.log << "Error in ~KeyFileGuard: " << e.what () << std::endl;
        };
    }